

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O1

size_t mp_vformat(char *data,size_t data_size,char *format,__va_list_tag *vl)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  char *__s;
  void *__src;
  bool bVar4;
  mp_double_cast cast;
  size_t sVar5;
  undefined8 *puVar6;
  double *pdVar7;
  ulong *puVar8;
  int *piVar9;
  uint *puVar10;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  bool bVar19;
  byte *pbVar20;
  char *pcVar21;
  float fVar22;
  byte *local_48;
  char *end;
  __va_list_tag *local_38;
  
  pcVar21 = (char *)0x0;
  end = (char *)data_size;
  local_38 = vl;
  do {
    bVar1 = *format;
    pbVar20 = (byte *)format;
    if (0x5a < bVar1) {
      if (bVar1 == 0x5b) {
        iVar14 = 1;
        uVar13 = 0;
        pbVar17 = (byte *)format;
        do {
          pbVar18 = pbVar17 + 1;
          bVar1 = pbVar17[1];
          if (bVar1 < 0x5d) {
            if (bVar1 < 0x4e) {
              if (bVar1 == 0x25) {
                if (pbVar17[2] != 0x25) {
                  bVar19 = iVar14 == 1;
                  goto LAB_00126cb4;
                }
                pbVar18 = pbVar17 + 2;
              }
              else if (bVar1 == 0) {
                __assert_fail("level == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                              ,0x5e,
                              "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                             );
              }
            }
            else if (bVar1 == 0x4e) {
              if (pbVar17[2] == 0x49) {
                bVar19 = iVar14 == 1 && pbVar17[3] == 0x4c;
LAB_00126cb4:
                uVar13 = uVar13 + bVar19;
              }
            }
            else if (bVar1 == 0x5b) goto LAB_00126c59;
          }
          else if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
            iVar14 = iVar14 + -1;
            if ((iVar14 == 0) && (iVar14 = 0, bVar1 != 0x5d)) {
              __assert_fail("level || *e == \']\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                            ,0x52,
                            "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                           );
            }
          }
          else if (bVar1 == 0x7b) {
LAB_00126c59:
            uVar13 = uVar13 + (iVar14 == 1);
            iVar14 = iVar14 + 1;
          }
          pbVar17 = pbVar18;
        } while (iVar14 != 0);
        lVar11 = (ulong)(0xffff < uVar13) * 2 + 3;
        if (uVar13 < 0x10) {
          lVar11 = 1;
        }
        pcVar21 = pcVar21 + lVar11;
        if (pcVar21 <= data_size) {
          if (uVar13 < 0x10) {
            *data = (byte)uVar13 | 0x90;
LAB_00126d35:
            data = (char *)((byte *)data + 1);
          }
          else {
            if (uVar13 < 0x10000) {
              *data = 0xdc;
              *(ushort *)((byte *)data + 1) = (ushort)uVar13 << 8 | (ushort)uVar13 >> 8;
              goto LAB_00126d75;
            }
            *data = 0xdd;
            *(uint *)((byte *)data + 1) =
                 uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
            ;
LAB_00126da2:
            data = (char *)((byte *)data + 5);
          }
        }
      }
      else if (bVar1 == 0x7b) {
        iVar14 = 1;
        uVar16 = 0;
        pbVar17 = (byte *)format;
        do {
          pbVar18 = pbVar17 + 1;
          bVar1 = pbVar17[1];
          if (bVar1 < 0x5d) {
            if (bVar1 < 0x4e) {
              if (bVar1 == 0x25) {
                if (pbVar17[2] != 0x25) {
                  bVar19 = iVar14 == 1;
                  goto LAB_00126bbd;
                }
                pbVar18 = pbVar17 + 2;
              }
              else if (bVar1 == 0) {
                __assert_fail("level == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                              ,0x7b,
                              "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                             );
              }
            }
            else if (bVar1 == 0x4e) {
              if (pbVar17[2] == 0x49) {
                bVar19 = iVar14 == 1 && pbVar17[3] == 0x4c;
LAB_00126bbd:
                uVar16 = (ulong)((int)uVar16 + (uint)bVar19);
              }
            }
            else if (bVar1 == 0x5b) goto LAB_00126b62;
          }
          else if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
            iVar14 = iVar14 + -1;
            if ((iVar14 == 0) && (iVar14 = 0, bVar1 != 0x7d)) {
              __assert_fail("level || *e == \'}\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                            ,0x6f,
                            "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                           );
            }
          }
          else if (bVar1 == 0x7b) {
LAB_00126b62:
            uVar16 = (ulong)((int)uVar16 + (uint)(iVar14 == 1));
            iVar14 = iVar14 + 1;
          }
          pbVar17 = pbVar18;
        } while (iVar14 != 0);
        if ((uVar16 & 1) != 0) {
          __assert_fail("count % 2 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                        ,0x7d,
                        "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
        }
        uVar13 = (uint)uVar16;
        lVar11 = (ulong)(0x1ffff < uVar13) * 2 + 3;
        if (uVar13 < 0x20) {
          lVar11 = 1;
        }
        pcVar21 = pcVar21 + lVar11;
        if (pcVar21 <= data_size) {
          uVar16 = uVar16 >> 1;
          if (uVar13 < 0x20) {
            *data = (byte)uVar16 | 0x80;
            goto LAB_00126d35;
          }
          if (0x1ffff < uVar13) {
            *data = 0xdf;
            uVar13 = (uint)uVar16;
            *(uint *)((byte *)data + 1) =
                 uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
            ;
            goto LAB_00126da2;
          }
          *data = 0xde;
          *(ushort *)((byte *)data + 1) = (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
LAB_00126d75:
          data = (char *)((byte *)data + 3);
        }
      }
      goto LAB_00127657;
    }
    if (bVar1 != 0x25) {
      if (bVar1 == 0x4e) {
        if ((((byte *)format)[1] == 0x49) && (((byte *)format)[2] == 0x4c)) {
          pcVar21 = pcVar21 + 1;
          pbVar20 = (byte *)format + 2;
          if (pcVar21 <= data_size) {
            *data = 0xc0;
            data = (char *)((byte *)data + 1);
          }
        }
      }
      else if (bVar1 == 0) {
        return (size_t)pcVar21;
      }
      goto LAB_00127657;
    }
    pbVar20 = (byte *)format + 1;
    bVar1 = ((byte *)format)[1];
    switch(bVar1) {
    case 0x62:
switchD_00126bfd_caseD_62:
      uVar13 = vl->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        piVar9 = (int *)((ulong)uVar13 + (long)vl->reg_save_area);
        vl->gp_offset = uVar13 + 8;
      }
      else {
        piVar9 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar9 + 2;
      }
      pcVar21 = pcVar21 + 1;
      if (pcVar21 <= data_size) {
        *data = *piVar9 != 0 | 0xc2;
        data = (char *)((byte *)data + 1);
      }
      goto LAB_001274e3;
    case 99:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x74:
switchD_00126bfd_caseD_63:
      if (bVar1 == 0x6c) {
        if (((byte *)format)[2] == 0x75) {
          uVar13 = vl->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar8 = (ulong *)((ulong)uVar13 + (long)vl->reg_save_area);
            vl->gp_offset = uVar13 + 8;
          }
          else {
            puVar8 = (ulong *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar8 + 1;
          }
          pbVar20 = (byte *)format + 2;
LAB_001272d0:
          uVar16 = *puVar8;
          goto LAB_001272d3;
        }
        if ((((byte *)format)[2] != 0x6c) ||
           ((((byte *)format)[3] != 0x69 && (((byte *)format)[3] != 100)))) {
          if ((((byte *)format)[2] != 0x6c) || (((byte *)format)[3] != 0x75)) goto LAB_00127314;
          uVar13 = vl->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar8 = (ulong *)((ulong)uVar13 + (long)vl->reg_save_area);
            vl->gp_offset = uVar13 + 8;
          }
          else {
            puVar8 = (ulong *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar8 + 1;
          }
          pbVar20 = (byte *)format + 3;
          goto LAB_001272d0;
        }
        uVar13 = vl->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar8 = (ulong *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->gp_offset = uVar13 + 8;
        }
        else {
          puVar8 = (ulong *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar8 + 1;
        }
        uVar16 = *puVar8;
LAB_00127462:
        pbVar20 = (byte *)format + 3;
        bVar4 = true;
      }
      else {
LAB_00127314:
        if (bVar1 != 0x68) {
LAB_001274d7:
          if (bVar1 != 0x25) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                          ,0xe5,
                          "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)")
            ;
          }
          goto LAB_001274e3;
        }
        if ((((byte *)format)[2] == 0x69) || (((byte *)format)[2] == 100)) {
          uVar13 = vl->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            piVar9 = (int *)((ulong)uVar13 + (long)vl->reg_save_area);
            vl->gp_offset = uVar13 + 8;
          }
          else {
            piVar9 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = piVar9 + 2;
          }
          uVar16 = (ulong)*piVar9;
          goto LAB_001273e4;
        }
        if (((byte *)format)[2] == 0x75) {
          uVar13 = vl->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar10 = (uint *)((ulong)uVar13 + (long)vl->reg_save_area);
            vl->gp_offset = uVar13 + 8;
          }
          else {
            puVar10 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar10 + 2;
          }
          uVar16 = (ulong)*puVar10;
          bVar4 = false;
          goto LAB_001273e6;
        }
        if ((((byte *)format)[2] == 0x68) &&
           ((((byte *)format)[3] == 0x69 || (((byte *)format)[3] == 100)))) {
          uVar13 = vl->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            piVar9 = (int *)((ulong)uVar13 + (long)vl->reg_save_area);
            vl->gp_offset = uVar13 + 8;
          }
          else {
            piVar9 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = piVar9 + 2;
          }
          uVar16 = (ulong)*piVar9;
          goto LAB_00127462;
        }
        if ((((byte *)format)[2] != 0x68) || (((byte *)format)[3] != 0x75)) goto LAB_001274d7;
        uVar13 = vl->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar10 = (uint *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->gp_offset = uVar13 + 8;
        }
        else {
          puVar10 = (uint *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar10 + 2;
        }
        pbVar20 = (byte *)format + 3;
        uVar16 = (ulong)*puVar10;
LAB_001272d3:
        bVar4 = false;
      }
      bVar19 = false;
      break;
    case 100:
    case 0x69:
      uVar13 = vl->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        piVar9 = (int *)((ulong)uVar13 + (long)vl->reg_save_area);
        vl->gp_offset = uVar13 + 8;
      }
      else {
        piVar9 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar9 + 2;
      }
      uVar16 = (ulong)*piVar9;
      bVar4 = true;
      goto LAB_00126f54;
    case 0x66:
      uVar13 = vl->fp_offset;
      if ((ulong)uVar13 < 0xa1) {
        pdVar7 = (double *)((ulong)uVar13 + (long)vl->reg_save_area);
        vl->fp_offset = uVar13 + 0x10;
      }
      else {
        pdVar7 = (double *)vl->overflow_arg_area;
        vl->overflow_arg_area = pdVar7 + 1;
      }
      pcVar21 = pcVar21 + 5;
      if (pcVar21 <= data_size) {
        fVar22 = (float)*pdVar7;
        *data = 0xca;
        *(uint *)((byte *)data + 1) =
             (uint)fVar22 >> 0x18 | ((uint)fVar22 & 0xff0000) >> 8 | ((uint)fVar22 & 0xff00) << 8 |
             (int)fVar22 << 0x18;
        data = (char *)((byte *)data + 5);
      }
      goto LAB_001274e3;
    case 0x6c:
      if (((byte *)format)[2] == 0x66) {
        uVar13 = vl->fp_offset;
        if ((ulong)uVar13 < 0xa1) {
          puVar8 = (ulong *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->fp_offset = uVar13 + 0x10;
        }
        else {
          puVar8 = (ulong *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar8 + 1;
        }
        pcVar21 = pcVar21 + 9;
        bVar19 = true;
        if (pcVar21 <= data_size) {
          uVar16 = *puVar8;
          *data = 0xcb;
          *(ulong *)((byte *)data + 1) =
               uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
               (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
               (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28
               | uVar16 << 0x38;
          data = (char *)((byte *)data + 9);
        }
        bVar4 = false;
        uVar16 = 0;
      }
      else {
        if (bVar1 != 0x6c) {
          if (bVar1 == 0x62) goto switchD_00126bfd_caseD_62;
          goto switchD_00126bfd_caseD_63;
        }
        if ((((byte *)format)[2] != 0x69) && (((byte *)format)[2] != 100))
        goto switchD_00126bfd_caseD_63;
        uVar13 = vl->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar8 = (ulong *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->gp_offset = uVar13 + 8;
        }
        else {
          puVar8 = (ulong *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar8 + 1;
        }
        uVar16 = *puVar8;
LAB_001273e4:
        bVar4 = true;
LAB_001273e6:
        bVar19 = false;
      }
      pbVar20 = (byte *)format + 2;
      break;
    case 0x70:
      uVar13 = vl->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar13 + (long)vl->reg_save_area);
        vl->gp_offset = uVar13 + 8;
      }
      else {
        puVar6 = (undefined8 *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar6 + 1;
      }
      pbVar17 = (byte *)*puVar6;
      lVar11 = 1;
      local_48 = pbVar17;
      do {
        cVar2 = ""[*local_48];
        lVar15 = (long)cVar2;
        if (lVar15 < 0) {
          if (*local_48 == 0xd9) {
            local_48 = local_48 + (ulong)local_48[1] + 2;
            goto LAB_00126ea8;
          }
          if (cVar2 < -0x1f) {
            mp_next_slowpath((char **)&local_48,lVar11);
          }
          else {
            lVar11 = lVar11 - lVar15;
            local_48 = local_48 + 1;
          }
          bVar19 = cVar2 >= -0x1f;
          vl = local_38;
          data_size = (size_t)end;
        }
        else {
          local_48 = local_48 + 1 + lVar15;
LAB_00126ea8:
          bVar19 = true;
        }
      } while ((bVar19) && (bVar19 = 1 < lVar11, lVar11 = lVar11 + -1, bVar19));
      uVar16 = (ulong)(uint)((int)local_48 - (int)pbVar17);
      pcVar21 = pcVar21 + uVar16;
      if (pcVar21 <= data_size) {
        memcpy(data,pbVar17,uVar16);
        data = (char *)((byte *)data + uVar16);
        vl = local_38;
        data_size = (size_t)end;
      }
LAB_001274e3:
      bVar19 = true;
      bVar4 = false;
      uVar16 = 0;
      break;
    case 0x73:
      uVar13 = vl->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar13 + (long)vl->reg_save_area);
        vl->gp_offset = uVar13 + 8;
      }
      else {
        puVar6 = (undefined8 *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar6 + 1;
      }
      __s = (char *)*puVar6;
      sVar5 = strlen(__s);
      iVar14 = 1;
      uVar13 = (uint)sVar5;
      if ((0x1f < uVar13) && (iVar14 = 2, 0xff < uVar13)) {
        iVar14 = (uint)(0xffff < uVar13) * 2 + 3;
      }
      pcVar21 = pcVar21 + (iVar14 + uVar13);
      bVar19 = true;
      if (end < pcVar21) {
        bVar4 = false;
        uVar16 = 0;
        vl = local_38;
        data_size = (size_t)end;
      }
      else {
        if (uVar13 < 0x20) {
          *data = (byte)sVar5 | 0xa0;
          lVar11 = 1;
        }
        else if (uVar13 < 0x100) {
          *data = 0xd9;
          ((byte *)data)[1] = (byte)sVar5;
          lVar11 = 2;
        }
        else if (uVar13 < 0x10000) {
          *data = 0xda;
          *(ushort *)((byte *)data + 1) = (ushort)sVar5 << 8 | (ushort)sVar5 >> 8;
          lVar11 = 3;
        }
        else {
          *data = 0xdb;
          *(uint *)((byte *)data + 1) =
               uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
          lVar11 = 5;
        }
        memcpy((byte *)data + lVar11,__s,sVar5 & 0xffffffff);
        data = (char *)((byte *)data + lVar11 + (sVar5 & 0xffffffff));
        bVar4 = false;
        uVar16 = 0;
        vl = local_38;
        data_size = (size_t)end;
      }
      break;
    case 0x75:
      uVar13 = vl->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar10 = (uint *)((ulong)uVar13 + (long)vl->reg_save_area);
        vl->gp_offset = uVar13 + 8;
      }
      else {
        puVar10 = (uint *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar10 + 2;
      }
      uVar16 = (ulong)*puVar10;
      bVar4 = false;
LAB_00126f54:
      bVar19 = false;
      break;
    default:
      if (bVar1 != 0x2e) {
        if (bVar1 == 0) {
          __assert_fail("f[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                        ,0x84,
                        "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
        }
        goto switchD_00126bfd_caseD_63;
      }
      if ((((byte *)format)[2] == 0x2a) && (((byte *)format)[3] == 0x73)) {
        uVar13 = vl->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar10 = (uint *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->gp_offset = uVar13 + 8;
        }
        else {
          puVar10 = (uint *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar10 + 2;
        }
        uVar13 = *puVar10;
        uVar3 = vl->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar3 + (long)vl->reg_save_area);
          vl->gp_offset = uVar3 + 8;
        }
        else {
          puVar6 = (undefined8 *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar6 + 1;
        }
        iVar14 = 1;
        if ((0x1f < uVar13) && (iVar14 = 2, 0xff < uVar13)) {
          iVar14 = (uint)(0xffff < uVar13) * 2 + 3;
        }
        pbVar20 = (byte *)format + 3;
        pcVar21 = pcVar21 + (iVar14 + uVar13);
        bVar19 = true;
        if (data_size < pcVar21) {
LAB_001270d8:
          bVar19 = true;
          pbVar20 = (byte *)format + 3;
          bVar4 = false;
          uVar16 = 0;
        }
        else {
          __src = (void *)*puVar6;
          if (uVar13 < 0x20) {
            *data = (byte)uVar13 | 0xa0;
            lVar11 = 1;
          }
          else if (uVar13 < 0x100) {
            *data = 0xd9;
            ((byte *)data)[1] = (byte)uVar13;
            lVar11 = 2;
          }
          else if (uVar13 < 0x10000) {
            *data = 0xda;
            *(ushort *)((byte *)data + 1) = (ushort)uVar13 << 8 | (ushort)uVar13 >> 8;
            lVar11 = 3;
          }
          else {
            *data = 0xdb;
            *(uint *)((byte *)data + 1) =
                 uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
            ;
            lVar11 = 5;
          }
          memcpy((byte *)data + lVar11,__src,(ulong)uVar13);
          data = (char *)((byte *)data + lVar11 + uVar13);
          bVar4 = false;
          uVar16 = 0;
          vl = local_38;
          data_size = (size_t)end;
        }
      }
      else {
        if ((((byte *)format)[2] != 0x2a) || (((byte *)format)[3] != 0x70))
        goto switchD_00126bfd_caseD_63;
        uVar13 = vl->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar10 = (uint *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->gp_offset = uVar13 + 8;
        }
        else {
          puVar10 = (uint *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar10 + 2;
        }
        uVar16 = (ulong)*puVar10;
        uVar13 = vl->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar13 + (long)vl->reg_save_area);
          vl->gp_offset = uVar13 + 8;
        }
        else {
          puVar6 = (undefined8 *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar6 + 1;
        }
        if (uVar16 == 0) {
          __assert_fail("len > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                        ,0xa8,
                        "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
        }
        pbVar20 = (byte *)format + 3;
        pcVar21 = pcVar21 + uVar16;
        bVar19 = true;
        if (pcVar21 <= data_size) {
          memcpy(data,(void *)*puVar6,uVar16);
          data = (char *)((byte *)data + uVar16);
          vl = local_38;
          data_size = (size_t)end;
          goto LAB_001270d8;
        }
        bVar4 = false;
        uVar16 = 0;
      }
    }
    uVar12 = (ushort)uVar16;
    if ((bVar4) && ((long)uVar16 < 0)) {
      lVar11 = 1;
      if ((((long)uVar16 < -0x20) && (lVar11 = 2, (long)uVar16 < -0x80)) &&
         (lVar11 = 3, (long)uVar16 < -0x8000)) {
        lVar11 = (ulong)((long)uVar16 < -0x80000000) * 4 + 5;
      }
      pcVar21 = pcVar21 + lVar11;
      if (pcVar21 <= data_size) {
        if ((long)uVar16 < -0x20) {
          if ((long)uVar16 < -0x80) {
            if ((long)uVar16 < -0x8000) {
              if ((long)uVar16 < -0x80000000) {
                uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
                *data = 0xd3;
LAB_0012764c:
                *(ulong *)((byte *)data + 1) = uVar16;
                data = (char *)((byte *)data + 9);
              }
              else {
                *data = 0xd2;
LAB_00127633:
                uVar13 = (uint)uVar16;
                *(uint *)((byte *)data + 1) =
                     uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
                data = (char *)((byte *)data + 5);
              }
            }
            else {
              uVar12 = uVar12 << 8 | uVar12 >> 8;
              *data = 0xd1;
LAB_00127609:
              *(ushort *)((byte *)data + 1) = uVar12;
              data = (char *)((byte *)data + 3);
            }
          }
          else {
            *data = 0xd0;
LAB_001275de:
            ((byte *)data)[1] = (byte)uVar16;
            data = (char *)((byte *)data + 2);
          }
        }
        else {
          uVar16 = uVar16 | 0xe0;
LAB_001275bd:
          *data = (byte)uVar16;
          data = (char *)((byte *)data + 1);
        }
      }
    }
    else if (!bVar19) {
      lVar11 = 1;
      if (((0x7f < uVar16) && (lVar11 = 2, 0xff < uVar16)) && (lVar11 = 3, 0xffff < uVar16)) {
        lVar11 = (ulong)(uVar16 >> 0x20 != 0) * 4 + 5;
      }
      pcVar21 = pcVar21 + lVar11;
      if (pcVar21 <= data_size) {
        if (0x7f < uVar16) {
          if (0xff < uVar16) {
            if (0xffff < uVar16) {
              if (uVar16 >> 0x20 != 0) {
                uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
                *data = 0xcf;
                goto LAB_0012764c;
              }
              *data = 0xce;
              goto LAB_00127633;
            }
            uVar12 = uVar12 << 8 | uVar12 >> 8;
            *data = 0xcd;
            goto LAB_00127609;
          }
          *data = 0xcc;
          goto LAB_001275de;
        }
        goto LAB_001275bd;
      }
    }
LAB_00127657:
    format = (char *)(pbVar20 + 1);
  } while( true );
}

Assistant:

size_t
mp_vformat(char *data, size_t data_size, const char *format, va_list vl)
{
	size_t result = 0;
	const char *f = NULL;

	for (f = format; *f; f++) {
		if (f[0] == '[') {
			uint32_t size = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						size++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '[' must be closed by ']' */
					assert(level || *e == ']');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						size++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					size++;
				}
			}
			/* opened '[' must be closed */
			assert(level == 0);
			result += mp_sizeof_array(size);
			if (result <= data_size)
				data = mp_encode_array(data, size);
		} else if (f[0] == '{') {
			uint32_t count = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						count++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '{' must be closed by '}' */
					assert(level || *e == '}');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						count++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					count++;
				}
			}
			/* opened '{' must be closed */
			assert(level == 0);
			/* since map is a pair list, count must be even */
			assert(count % 2 == 0);
			uint32_t size = count / 2;
			result += mp_sizeof_map(size);
			if (result <= data_size)
				data = mp_encode_map(data, size);
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
				f += 2;
			} else if (f[0] == 'p') {
				const char *p = va_arg(vl, const char *);
				const char *end = p;
				mp_next(&end);
				uint32_t len = (uint32_t)(end - p);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 'p') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *p = va_arg(vl, const char *);
				assert(len > 0);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
				f += 2;
			} else if(f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				result += mp_sizeof_float(v);
				if (result <= data_size)
					data = mp_encode_float(data, v);
			} else if(f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				result += mp_sizeof_double(v);
				if (result <= data_size)
					data = mp_encode_double(data, v);
				f++;
			} else if(f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				result += mp_sizeof_bool(v);
				if (result <= data_size)
					data = mp_encode_bool(data, v);
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1 && int_value < 0) {
				result += mp_sizeof_int(int_value);
				if (result <= data_size)
					data = mp_encode_int(data, int_value);
			} else if(int_status) {
				result += mp_sizeof_uint(int_value);
				if (result <= data_size)
					data = mp_encode_uint(data, int_value);
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			result += mp_sizeof_nil();
			if (result <= data_size)
				data = mp_encode_nil(data);
			f += 2;
		}
	}
	return result;
}